

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkCollectObjects(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pVVar4 = pNtk->vObjs;
  if (0 < pVVar4->nSize) {
    iVar9 = 0;
    uVar8 = 100;
    lVar6 = 0;
    do {
      pvVar1 = pVVar4->pArray[lVar6];
      if (pvVar1 != (void *)0x0) {
        iVar7 = (int)uVar8;
        if (iVar9 == iVar7) {
          if (iVar7 < 0x10) {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
            }
            pVVar2->pArray = ppvVar3;
            pVVar2->nCap = 0x10;
            uVar8 = 0x10;
          }
          else {
            uVar8 = (ulong)(uint)(iVar7 * 2);
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(uVar8 * 8);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,uVar8 * 8);
            }
            pVVar2->pArray = ppvVar3;
            pVVar2->nCap = iVar7 * 2;
          }
        }
        else {
          ppvVar3 = pVVar2->pArray;
        }
        lVar5 = (long)iVar9;
        iVar9 = iVar9 + 1;
        pVVar2->nSize = iVar9;
        ppvVar3[lVar5] = pvVar1;
        pVVar4 = pNtk->vObjs;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar4->nSize);
  }
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Abc_NtkCollectObjects( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;
    int i;
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachObj( pNtk, pNode, i )
        Vec_PtrPush( vNodes, pNode );
    return vNodes;
}